

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O0

int UUID_generate(UUID_T *uuid)

{
  UNIQUEID_RESULT UVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  char *uid;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t malloc_size;
  char *uuid_string;
  LOGGER_LOG l;
  int result;
  UUID_T *uuid_local;
  
  if (uuid == (UUID_T *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                ,"UUID_generate",0x9d,1,"Invalid argument (uuid is NULL)");
    }
    l._4_4_ = 0x9e;
  }
  else {
    uid = (char *)malloc(0x25);
    if (uid == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                  ,"UUID_generate",0xa8,1,"Failed allocating UUID string, size=%zu",0x25);
      }
      l._4_4_ = 0xa9;
    }
    else {
      memset(uid,0,0x25);
      UVar1 = UniqueId_Generate(uid,0x25);
      if (UVar1 == UNIQUEID_OK) {
        iVar2 = UUID_from_string(uid,uuid);
        if (iVar2 == 0) {
          l._4_4_ = 0;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                      ,"UUID_generate",0xba,1,"Failed parsing UUID string");
          }
          l._4_4_ = 0xbb;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                    ,"UUID_generate",0xb3,1,"Failed generating UUID");
        }
        l._4_4_ = 0xb4;
      }
      free(uid);
    }
  }
  return l._4_4_;
}

Assistant:

int UUID_generate(UUID_T* uuid)
{
    int result;

    // Codes_SRS_UUID_09_001: [ If uuid is NULL, UUID_generate shall return a non-zero value ]
    if (uuid == NULL)
    {
        LogError("Invalid argument (uuid is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        char* uuid_string;
        size_t malloc_size;
        if ((malloc_size = safe_multiply_size_t(sizeof(char), UUID_STRING_SIZE)) == SIZE_MAX || 
            (uuid_string = (char*)malloc(malloc_size)) == NULL)
        {
            // Codes_SRS_UUID_09_003: [ If the UUID string fails to be obtained, UUID_generate shall fail and return a non-zero value ]
            LogError("Failed allocating UUID string, size=%zu", malloc_size);
            result = MU_FAILURE;
        }
        else
        {
            (void)memset(uuid_string, 0, sizeof(char) * UUID_STRING_SIZE);

            // Codes_SRS_UUID_09_002: [ UUID_generate shall obtain an UUID string from UniqueId_Generate ]
            if (UniqueId_Generate(uuid_string, UUID_STRING_SIZE) != UNIQUEID_OK)
            {
                // Codes_SRS_UUID_09_003: [ If the UUID string fails to be obtained, UUID_generate shall fail and return a non-zero value ]
                LogError("Failed generating UUID");
                result = MU_FAILURE;
            }
            // Codes_SRS_UUID_09_004: [ The UUID string shall be parsed into an UUID_T type (16 unsigned char array) and filled in uuid ]
            else if (UUID_from_string(uuid_string, uuid) != 0)
            {
                // Codes_SRS_UUID_09_005: [ If uuid fails to be set, UUID_generate shall fail and return a non-zero value ]
                LogError("Failed parsing UUID string");
                result = MU_FAILURE;
            }
            else
            {
                // Codes_SRS_UUID_09_006: [ If no failures occur, UUID_generate shall return zero ]
                result = __SUCCESS__;
            }

            free(uuid_string);
        }
    }

    return result;
}